

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O1

bool axl::io::matchWildcard(StringRef *string0,StringRef *wildcard0)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  
  if (wildcard0->m_length == 0) {
    pcVar3 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    pcVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       (wildcard0);
  }
  if (string0->m_length == 0) {
    do {
      cVar7 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar7 == '*');
  }
  else {
    pcVar4 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       (string0);
    pcVar5 = (char *)0x0;
    pcVar6 = (char *)0x0;
    do {
      cVar7 = *pcVar3;
      if (cVar7 != '*') {
        do {
          while( true ) {
            if ((cVar7 == '?') || (cVar2 = *pcVar4, cVar2 == cVar7)) goto LAB_00137a67;
            if (pcVar6 == (char *)0x0) {
              return false;
            }
            if ((pcVar3 != pcVar6) && (pcVar3 = pcVar6 + 1, cVar2 != *pcVar6)) break;
            if (cVar2 == '\0') {
              return false;
            }
            pcVar4 = pcVar4 + 1;
            cVar7 = *pcVar3;
            if (cVar7 == '*') goto LAB_00137a34;
          }
          pcVar4 = pcVar5 + 1;
          cVar7 = *pcVar6;
          pcVar5 = pcVar4;
          pcVar3 = pcVar6;
        } while (cVar7 != '*');
      }
LAB_00137a34:
      do {
        cVar7 = pcVar3[1];
        pcVar6 = pcVar3 + 1;
        pcVar3 = pcVar6;
      } while (cVar7 == '*');
      if (cVar7 == '\0') {
        return true;
      }
      pcVar5 = pcVar4;
      if (cVar7 != '?') {
        while (pcVar5 = pcVar4, *pcVar4 != cVar7) {
          pcVar5 = pcVar4 + 1;
          pcVar4 = pcVar4 + 1;
          if (*pcVar5 == '\0') {
            return false;
          }
        }
      }
LAB_00137a67:
      pcVar3 = pcVar3 + 1;
      pcVar1 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    } while (*pcVar1 != '\0');
    do {
      cVar7 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar7 == '*');
  }
  return cVar7 == '\0';
}

Assistant:

bool
matchWildcard(
	const sl::StringRef& string0,
	const sl::StringRef& wildcard0
) {
	const char* wildcard = wildcard0.sz();

	if (string0.isEmpty()) { // empty input shortcut
		while (*wildcard == '*')
			wildcard++;

		return *wildcard == '\0';
	}

	const char* string = string0.sz();
	const char* stringBookmark = NULL;
	const char* wildcardBookmark = NULL;
	char c;

	for (;;) {
		if (*wildcard == '*') {
			while (*++wildcard == '*')
				;

			if (!*wildcard)
				return true;

			if (*wildcard != '?') {
				while (*string != *wildcard) {
					if (!(*(++string)))
						return false;
				}
			}

			wildcardBookmark = wildcard;
			stringBookmark = string;
		} else {
			c = *string;
			if (c != *wildcard && *wildcard != '?') {
				if (wildcardBookmark) {
					if (wildcard != wildcardBookmark) {
						wildcard = wildcardBookmark;

						if (c != *wildcard) {
							string = ++stringBookmark;
							continue;
						} else {
							wildcard++;
						}
					}

					if (*string) {
						string++;
						continue;
					}
				}

				return false;
			}
		}

		string++;
		wildcard++;

		if (!*string) {
			while (*wildcard == '*')
				wildcard++;

			return !*wildcard;
		}
	}
}